

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpWatchDog.c
# Opt level: O2

void watchDogThreadFunc(void *arg)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  deUint64 dVar3;
  ulong uVar4;
  
  while( true ) {
    if (*(int *)((long)arg + 0x30) != 0) {
      return;
    }
    dVar3 = deGetMicroseconds();
    uVar4 = dVar3 - *(long *)((long)arg + 0x20);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    if ((*(int *)((long)arg + 0x14) < SUB164(auVar1 / ZEXT816(1000000),0)) ||
       (uVar4 = dVar3 - *(long *)((long)arg + 0x18), auVar2._8_8_ = 0, auVar2._0_8_ = uVar4,
       *(int *)((long)arg + 0x10) < SUB164(auVar2 / ZEXT816(1000000),0))) break;
    deSleep(100);
  }
  (**arg)(arg,*(undefined8 *)((long)arg + 8),uVar4 % 1000000);
  return;
}

Assistant:

static void watchDogThreadFunc (void* arg)
{
	qpWatchDog* dog = (qpWatchDog*)arg;
	DE_ASSERT(dog);

	DBGPRINT(("watchDogThreadFunc(): start\n"));

	while (dog->status == STATUS_THREAD_RUNNING)
	{
		deUint64	curTime					= deGetMicroseconds();
		int			totalSecondsPassed		= (int)((curTime - dog->resetTime) / 1000000ull);
		int			secondsSinceLastTouch	= (int)((curTime - dog->lastTouchTime) / 1000000ull);

		if ((secondsSinceLastTouch > dog->intervalTimeLimit) || (totalSecondsPassed > dog->totalTimeLimit))
		{
			DBGPRINT(("watchDogThreadFunc(): call timeout func\n"));
			dog->timeOutFunc(dog, dog->timeOutUserPtr);
			break;
		}

		deSleep(100);
	}

	DBGPRINT(("watchDogThreadFunc(): stop\n"));
}